

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

char * ggml_status_to_string(ggml_status status)

{
  if ((uint)(status + 2) < 4) {
    return &DAT_0014a480 + *(int *)(&DAT_0014a480 + (ulong)(uint)(status + 2) * 4);
  }
  return "GGML status: unknown";
}

Assistant:

const char * ggml_status_to_string(enum ggml_status status) {
    switch (status) {
        case GGML_STATUS_ALLOC_FAILED: return "GGML status: error (failed to allocate memory)";
        case GGML_STATUS_FAILED:       return "GGML status: error (operation failed)";
        case GGML_STATUS_SUCCESS:      return "GGML status: success";
        case GGML_STATUS_ABORTED:      return "GGML status: warning (operation aborted)";
    }

    return "GGML status: unknown";
}